

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *ctx;
  GLFWwindow *window;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  handle = glfwCreateWindow(400,400,"Boing (classic Amiga demo)",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwSetWindowAspectRatio(handle,1,1);
    glfwSetFramebufferSizeCallback(handle,reshape);
    glfwSetKeyCallback(handle,key_callback);
    glfwSetMouseButtonCallback(handle,mouse_button_callback);
    glfwSetCursorPosCallback(handle,cursor_position_callback);
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    glfwGetFramebufferSize(handle,&width,&height);
    ctx = handle;
    reshape(handle,width,height);
    glfwSetTime(0.0);
    init((EVP_PKEY_CTX *)ctx);
    do {
      t = glfwGetTime();
      dt = t - t_old;
      t_old = t;
      display();
      glfwSwapBuffers(handle);
      glfwPollEvents();
      iVar1 = glfwWindowShouldClose(handle);
    } while (iVar1 == 0);
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main( void )
{
   GLFWwindow* window;

   /* Init GLFW */
   if( !glfwInit() )
      exit( EXIT_FAILURE );

   window = glfwCreateWindow( 400, 400, "Boing (classic Amiga demo)", NULL, NULL );
   if (!window)
   {
       glfwTerminate();
       exit( EXIT_FAILURE );
   }

   glfwSetWindowAspectRatio(window, 1, 1);

   glfwSetFramebufferSizeCallback(window, reshape);
   glfwSetKeyCallback(window, key_callback);
   glfwSetMouseButtonCallback(window, mouse_button_callback);
   glfwSetCursorPosCallback(window, cursor_position_callback);

   glfwMakeContextCurrent(window);
   gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
   glfwSwapInterval( 1 );

   glfwGetFramebufferSize(window, &width, &height);
   reshape(window, width, height);

   glfwSetTime( 0.0 );

   init();

   /* Main loop */
   for (;;)
   {
       /* Timing */
       t = glfwGetTime();
       dt = t - t_old;
       t_old = t;

       /* Draw one frame */
       display();

       /* Swap buffers */
       glfwSwapBuffers(window);
       glfwPollEvents();

       /* Check if we are still running */
       if (glfwWindowShouldClose(window))
           break;
   }

   glfwTerminate();
   exit( EXIT_SUCCESS );
}